

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O3

void Sfm_NtkPrepare(Sfm_Ntk_t *p)

{
  uint uVar1;
  Sfm_Par_t *pSVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Wrd_t *pVVar7;
  word *__s;
  Vec_Wec_t *pVVar8;
  sat_solver *s;
  ulong uVar9;
  
  uVar1 = (p->vLevels).nSize;
  if ((ulong)uVar1 == 0) {
    iVar3 = 0;
  }
  else {
    piVar6 = (p->vLevels).pArray;
    iVar3 = *piVar6;
    if (1 < (int)uVar1) {
      uVar9 = 1;
      do {
        iVar4 = piVar6[uVar9];
        if (iVar3 <= iVar4) {
          iVar3 = iVar4;
        }
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
  }
  pSVar2 = p->pPars;
  p->nLevelMax = iVar3 + pSVar2->nGrowthLevel;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  p->vNodes = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  p->vDivs = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  p->vRoots = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  p->vTfo = pVVar5;
  iVar3 = pSVar2->nWinSizeMax;
  pVVar7 = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar4 = iVar3;
  }
  pVVar7->nCap = iVar4;
  if (iVar4 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar4 << 3);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = iVar3;
  memset(__s,0,(long)iVar3 << 3);
  p->vDivCexes = pVVar7;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  p->vOrder = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  p->vDivVars = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  p->vDivIds = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  p->vLits = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar5->pArray = piVar6;
  p->vValues = pVVar5;
  pVVar8 = (Vec_Wec_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  pVVar5 = (Vec_Int_t *)calloc(100,0x10);
  pVVar8->pArray = pVVar5;
  p->vClauses = pVVar8;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x10;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  pVVar5->pArray = piVar6;
  p->vFaninMap = pVVar5;
  s = sat_solver_new();
  p->pSat = s;
  sat_solver_setnvars(s,p->pPars->nWinSizeMax);
  return;
}

Assistant:

void Sfm_NtkPrepare( Sfm_Ntk_t * p )
{
    p->nLevelMax = Vec_IntFindMax(&p->vLevels) + p->pPars->nGrowthLevel;
    p->vNodes    = Vec_IntAlloc( 1000 );
    p->vDivs     = Vec_IntAlloc( 100 );
    p->vRoots    = Vec_IntAlloc( 1000 );
    p->vTfo      = Vec_IntAlloc( 1000 );
    p->vDivCexes = Vec_WrdStart( p->pPars->nWinSizeMax );
    p->vOrder    = Vec_IntAlloc( 100 );
    p->vDivVars  = Vec_IntAlloc( 100 );
    p->vDivIds   = Vec_IntAlloc( 1000 );
    p->vLits     = Vec_IntAlloc( 100 );
    p->vValues   = Vec_IntAlloc( 100 );
    p->vClauses  = Vec_WecAlloc( 100 );
    p->vFaninMap = Vec_IntAlloc( 10 );
    p->pSat      = sat_solver_new();
    sat_solver_setnvars( p->pSat, p->pPars->nWinSizeMax );
}